

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

Vec3 vdiv(Vec3 v,float t)

{
  Vec3 VVar1;
  float t_local;
  undefined4 local_20;
  undefined4 uStack_1c;
  Vec3 v_local;
  
  local_20 = v.x;
  uStack_1c = v.y;
  VVar1.y = uStack_1c / t;
  VVar1.x = local_20 / t;
  VVar1.z = v.z / t;
  return VVar1;
}

Assistant:

static inline Vec3 vdiv(Vec3 v, float t) {
    return (Vec3) {
        v.x / t,
            v.y / t,
            v.z / t
            };
}